

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int pagerOpenWal(Pager *pPager)

{
  sqlite3_vfs *psVar1;
  sqlite3_filename pcVar2;
  sqlite3_file *psVar3;
  int iVar4;
  uint uVar5;
  Wal *pWal;
  u64 n;
  u8 uVar6;
  uint local_44;
  sqlite3_file *local_40;
  i64 local_38;
  
  if (pPager->exclusiveMode == '\0') {
    uVar6 = '\0';
  }
  else {
    iVar4 = pagerExclusiveLock(pPager);
    if (iVar4 != 0) goto LAB_00150680;
    uVar6 = (pPager->exclusiveMode != '\0') * '\x02';
  }
  psVar1 = pPager->pVfs;
  local_40 = pPager->fd;
  pcVar2 = pPager->zWal;
  local_38 = pPager->journalSizeLimit;
  pPager->pWal = (Wal *)0x0;
  n = (long)psVar1->szOsFile + 0x90;
  pWal = (Wal *)sqlite3Malloc(n);
  if (pWal == (Wal *)0x0) {
    iVar4 = 7;
  }
  else {
    memset(pWal,0,n);
    pWal->pVfs = psVar1;
    pWal->pWalFd = (sqlite3_file *)(pWal + 1);
    pWal->pDbFd = local_40;
    pWal->readLock = -1;
    pWal->mxWalSize = local_38;
    pWal->zWalName = pcVar2;
    pWal->syncHeader = '\x01';
    pWal->padToSectorBoundary = '\x01';
    pWal->exclusiveMode = uVar6;
    local_44 = 0x80006;
    iVar4 = (*psVar1->xOpen)(psVar1,pcVar2,(sqlite3_file *)(pWal + 1),0x80006,(int *)&local_44);
    if (iVar4 == 0) {
      if ((local_44 & 1) != 0) {
        pWal->readOnly = '\x01';
      }
      if (local_40->pMethods != (sqlite3_io_methods *)0x0) {
        uVar5 = (*local_40->pMethods->xDeviceCharacteristics)(local_40);
        if ((uVar5 >> 10 & 1) != 0) {
          pWal->syncHeader = '\0';
        }
        if ((uVar5 >> 0xc & 1) != 0) {
          pWal->padToSectorBoundary = '\0';
        }
      }
      pPager->pWal = pWal;
      iVar4 = 0;
    }
    else {
      walIndexClose(pWal,0);
      psVar3 = pWal->pWalFd;
      if (psVar3->pMethods != (sqlite3_io_methods *)0x0) {
        (*psVar3->pMethods->xClose)(psVar3);
        psVar3->pMethods = (sqlite3_io_methods *)0x0;
      }
      sqlite3_free(pWal);
    }
  }
LAB_00150680:
  pagerFixMaplimit(pPager);
  return iVar4;
}

Assistant:

static int pagerOpenWal(Pager *pPager){
  int rc = SQLITE_OK;

  assert( pPager->pWal==0 && pPager->tempFile==0 );
  assert( pPager->eLock==SHARED_LOCK || pPager->eLock==EXCLUSIVE_LOCK );

  /* If the pager is already in exclusive-mode, the WAL module will use
  ** heap-memory for the wal-index instead of the VFS shared-memory
  ** implementation. Take the exclusive lock now, before opening the WAL
  ** file, to make sure this is safe.
  */
  if( pPager->exclusiveMode ){
    rc = pagerExclusiveLock(pPager);
  }

  /* Open the connection to the log file. If this operation fails,
  ** (e.g. due to malloc() failure), return an error code.
  */
  if( rc==SQLITE_OK ){
    rc = sqlite3WalOpen(pPager->pVfs,
        pPager->fd, pPager->zWal, pPager->exclusiveMode,
        pPager->journalSizeLimit, &pPager->pWal
    );
  }
  pagerFixMaplimit(pPager);

  return rc;
}